

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int ParseEXRMultipartHeaderFromFile
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,char *filename,
              char **err)

{
  undefined4 in_EAX;
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  size_type __n;
  reference memory;
  undefined1 auVar3 [16];
  allocator_type local_51;
  size_type local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  
  auVar3._0_4_ = -(uint)(exr_headers == (EXRHeader ***)0x0);
  auVar3._4_4_ = -(uint)(num_headers == (int *)0x0);
  auVar3._8_4_ = -(uint)(exr_version == (EXRVersion *)0x0);
  auVar3._12_4_ = -(uint)(filename == (char *)0x0);
  iVar1 = movmskps(in_EAX,auVar3);
  if (iVar1 == 0) {
    __stream = fopen(filename,"rb");
    if (__stream != (FILE *)0x0) {
      fseek(__stream,0,2);
      __n = ftell(__stream);
      fseek(__stream,0,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&buf,__n,&local_51);
      local_50 = fread(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_start,1,__n,__stream);
      fclose(__stream);
      if (local_50 == __n) {
        memory = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&buf,0);
        iVar1 = ParseEXRMultipartHeaderFromMemory(exr_headers,num_headers,exr_version,memory,err);
      }
      else {
        iVar1 = -5;
        if (err != (char **)0x0) {
          *err = "fread error.";
        }
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return iVar1;
    }
    iVar1 = -6;
    if (err == (char **)0x0) {
      return -6;
    }
    pcVar2 = "Cannot read file.";
  }
  else {
    iVar1 = -3;
    if (err == (char **)0x0) {
      return -3;
    }
    pcVar2 = "Invalid argument.";
  }
  *err = pcVar2;
  return iVar1;
}

Assistant:

int ParseEXRMultipartHeaderFromFile(EXRHeader ***exr_headers, int *num_headers,
                                    const EXRVersion *exr_version,
                                    const char *filename, const char **err) {
  if (exr_headers == NULL || num_headers == NULL || exr_version == NULL ||
      filename == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#ifdef _WIN32
  FILE *fp = NULL;
  fopen_s(&fp, filename, "rb");
#else
  FILE *fp = fopen(filename, "rb");
#endif
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);

    if (ret != filesize) {
      if (err) {
        (*err) = "fread error.";
      }
      return TINYEXR_ERROR_INVALID_FILE;
    }
  }

  return ParseEXRMultipartHeaderFromMemory(exr_headers, num_headers,
                                           exr_version, &buf.at(0), err);
}